

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_ExtractAndInsertNodeHandleSet_Test::TestBody
          (Btree_ExtractAndInsertNodeHandleSet_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int,_int>_> matcher;
  initializer_list<int> iVar1;
  initializer_list<int> iVar2;
  bool bVar3;
  char *pcVar4;
  value_type *lhs;
  char *in_R9;
  iterator iVar5;
  iterator position;
  iterator position_00;
  _Head_base<0UL,_int,_false> matcher_00;
  undefined8 in_stack_fffffffffffffb38;
  AssertHelper local_418;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_6;
  string local_3e8;
  AssertHelper local_3c8;
  Message local_3c0;
  bool local_3b1;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_380;
  Message local_378;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__2;
  Message local_350;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *local_348;
  int local_340;
  key_arg<int> local_334;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_330;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_5;
  Message local_308;
  int local_2fc;
  testing local_2f8 [4];
  char local_2f4 [4];
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2c0;
  Message local_2b8;
  int local_2ac;
  testing local_2a8 [4];
  char local_2a4 [4];
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_3;
  key_arg<int> local_27c;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  int local_270;
  node_type local_264;
  allocator<int> local_25a;
  key_compare local_259;
  int local_258 [2];
  iterator local_250;
  size_type local_248;
  undefined1 local_240 [8];
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> src2;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_;
  Message local_198;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *local_190;
  int local_188;
  key_arg<int> local_17c;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_178;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_2;
  Message local_150;
  int local_144;
  testing local_140 [4];
  char local_13c [4];
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  insert_return_type res;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> other;
  Message local_e8;
  int local_e0 [4];
  testing local_d0 [8];
  _Tuple_impl<2UL,_int,_int> _Stack_c8;
  char local_c0 [16];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  key_arg<int> local_8c;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  int local_80;
  node_type local_74;
  node_type nh;
  allocator<int> local_5a;
  key_compare local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_> src1;
  Btree_ExtractAndInsertNodeHandleSet_Test *this_local;
  
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 3;
  local_58[3] = 4;
  local_58[4] = 5;
  local_38 = local_58;
  local_30 = 5;
  src1.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  .tree_.size_ = (size_type)this;
  std::allocator<int>::allocator(&local_5a);
  iVar2._M_len = local_30;
  iVar2._M_array = local_38;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_>::btree_set_container
            ((btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28,iVar2,&local_59,
             &local_5a);
  std::allocator<int>::~allocator(&local_5a);
  local_8c = 3;
  iVar5 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
          ::find<int>((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                       *)local_28,&local_8c);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )iVar5.node;
  local_80 = iVar5.position;
  position._12_4_ = 0;
  position.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
        *)SUB128(iVar5._0_12_,0);
  position.position = SUB124(iVar5._0_12_,8);
  local_88._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::extract(&local_74,
            (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             *)local_28,position);
  local_e0[3] = 1;
  local_e0[2] = 2;
  local_e0[1] = 4;
  local_e0[0] = 5;
  testing::ElementsAre<int,int,int,int>(local_d0,local_e0 + 3,local_e0 + 2,local_e0 + 1,local_e0);
  matcher_00._M_head_impl =
       (int)_Stack_c8.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
  .super__Head_base<1UL,_int,_false>._M_head_impl = (int)in_stack_fffffffffffffb38;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
  .super__Tuple_impl<2UL,_int,_int> = _Stack_c8;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int>>>
  ::operator()(local_b0,local_c0,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"src1");
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar3) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &other.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x720,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &other.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .tree_.size_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &other.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_>::btree_set
            ((btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)
             &res.node.
              super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
              .slot_space_);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::insert((insert_return_type *)&gtest_ar_1.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            *)&res.node.
               super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
               .slot_space_,&local_74);
  local_144 = 3;
  testing::ElementsAre<int>(local_140,&local_144);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>
            ((ElementsAreMatcher<std::tuple<int>_>)matcher_00._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_138,local_13c,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"other");
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar3) {
    testing::Message::Message(&local_150);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x723,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_17c = 3;
  iVar5 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
          ::find<int>((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                       *)&res.node.
                          super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                          .slot_space_,&local_17c);
  local_190 = iVar5.node;
  local_188 = iVar5.position;
  local_178.node = local_190;
  local_178.position = local_188;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_nullptr>
            ((EqHelper *)local_168,"res.position","other.find(3)",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)&gtest_ar_1.message_,&local_178);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar3) {
    testing::Message::Message(&local_198);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x724,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b0,(bool *)&res.position.position,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar3) {
    testing::Message::Message(&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1b0,
               (AssertionResult *)"res.inserted","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x725,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1f1 = node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
              ::empty((node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                       *)&res.position.field_0xc);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar3) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &src2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .tree_.size_,(internal *)local_1f0,(AssertionResult *)"res.node.empty()","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x726,pcVar4);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string
              ((string *)
               &src2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_258[0] = 3;
  local_258[1] = 4;
  local_250 = local_258;
  local_248 = 2;
  std::allocator<int>::allocator(&local_25a);
  iVar1._M_len = local_248;
  iVar1._M_array = local_250;
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_>::btree_set_container
            ((btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)local_240,iVar1,&local_259,
             &local_25a);
  std::allocator<int>::~allocator(&local_25a);
  local_27c = 3;
  iVar5 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
          ::find<int>((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                       *)local_240,&local_27c);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )iVar5.node;
  local_270 = iVar5.position;
  position_00._12_4_ = 0;
  position_00.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
        *)SUB128(iVar5._0_12_,0);
  position_00.position = SUB124(iVar5._0_12_,8);
  local_278._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gtest_ar_3.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::extract(&local_264,
            (btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             *)local_240,position_00);
  node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
  ::operator=(&local_74,&local_264);
  node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
  ::~node_handle(&local_264);
  local_2ac = 4;
  testing::ElementsAre<int>(local_2a8,&local_2ac);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>
            ((ElementsAreMatcher<std::tuple<int>_>)matcher_00._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_2a0,local_2a4,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"src2");
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar3) {
    testing::Message::Message(&local_2b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  ::insert((insert_return_type *)&gtest_ar_4.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            *)&res.node.
               super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
               .slot_space_,&local_74);
  InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
  ::operator=((InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
               *)&gtest_ar_1.message_,
              (InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
               *)&gtest_ar_4.message_);
  InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
  ::~InsertReturnType((InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
                       *)&gtest_ar_4.message_);
  local_2fc = 3;
  testing::ElementsAre<int>(local_2f8,&local_2fc);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>
            ((ElementsAreMatcher<std::tuple<int>_>)matcher_00._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int>>>::operator()
            (local_2f0,local_2f4,(btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)"other");
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar3) {
    testing::Message::Message(&local_308);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  local_334 = 3;
  iVar5 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
          ::find<int>((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                       *)&res.node.
                          super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                          .slot_space_,&local_334);
  local_348 = iVar5.node;
  local_340 = iVar5.position;
  local_330.node = local_348;
  local_330.position = local_340;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_nullptr>
            ((EqHelper *)local_320,"res.position","other.find(3)",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              *)&gtest_ar_1.message_,&local_330);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar3) {
    testing::Message::Message(&local_350);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_369 = (bool)(~(byte)res.position.position & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_368,&local_369,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar3) {
    testing::Message::Message(&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_368,
               (AssertionResult *)"res.inserted","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_380,&local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  local_3b1 = node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
              ::empty((node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
                       *)&res.position.field_0xc);
  local_3b1 = !local_3b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3b0,&local_3b1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar3) {
    testing::Message::Message(&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e8,(internal *)local_3b0,(AssertionResult *)"res.node.empty()","true","false"
               ,in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x72f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    testing::Message::~Message(&local_3c0);
  }
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  if (gtest_ar_6.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    lhs = node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
          ::value((node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
                   *)&res.position.field_0xc);
    local_404 = 3;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_400,"res.node.value()","3",lhs,&local_404);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
    if (!bVar3) {
      testing::Message::Message(&local_410);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
      testing::internal::AssertHelper::AssertHelper
                (&local_418,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x730,pcVar4);
      testing::internal::AssertHelper::operator=(&local_418,&local_410);
      testing::internal::AssertHelper::~AssertHelper(&local_418);
      testing::Message::~Message(&local_410);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_>::~btree_set
            ((btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)local_240);
  InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
  ::~InsertReturnType((InsertReturnType<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_phmap::priv::node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>_>
                       *)&gtest_ar_1.message_);
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_>::~btree_set
            ((btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)
             &res.node.
              super_node_handle_base<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>_>
              .slot_space_);
  node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
  ::~node_handle(&local_74);
  btree_set<int,_phmap::Less<int>,_std::allocator<int>_>::~btree_set
            ((btree_set<int,_phmap::Less<int>,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(Btree, ExtractAndInsertNodeHandleSet) {
        phmap::btree_set<int> src1 = {1, 2, 3, 4, 5};
        auto nh = src1.extract(src1.find(3));
        EXPECT_THAT(src1, ElementsAre(1, 2, 4, 5));
        phmap::btree_set<int> other;
        phmap::btree_set<int>::insert_return_type res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_TRUE(res.inserted);
        EXPECT_TRUE(res.node.empty());

        phmap::btree_set<int> src2 = {3, 4};
        nh = src2.extract(src2.find(3));
        EXPECT_THAT(src2, ElementsAre(4));
        res = other.insert(std::move(nh));
        EXPECT_THAT(other, ElementsAre(3));
        EXPECT_EQ(res.position, other.find(3));
        EXPECT_FALSE(res.inserted);
        ASSERT_FALSE(res.node.empty());
        EXPECT_EQ(res.node.value(), 3);
    }